

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
               (Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
                *m)

{
  undefined4 local_fc;
  initializer_list<unsigned_int> local_f8;
  initializer_list<unsigned_int> local_e8;
  undefined8 *local_d8;
  char *local_d0;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x39f);
  local_e8._M_len = local_e8._M_len & 0xffffffffffffff00;
  local_e8._M_array = (iterator)&PTR__lazy_ostream_001f1058;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_f8._M_array =
       (iterator)
       CONCAT44(local_f8._M_array._4_4_,(m->matrix_).super_Matrix_dimension_option.maxDim_);
  local_fc = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_e8,&local_90,0x39f,1,2,&local_f8,"m.get_max_dimension()",&local_fc,"2");
  local_e8._M_array = (iterator)0x100000000;
  local_e8._M_len = 0x300000002;
  local_d8 = (undefined8 *)0x500000004;
  local_f8._M_len = 6;
  local_f8._M_array = (iterator)&local_e8;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
              *)&m->matrix_,&local_f8,-1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  local_f8._M_array = (iterator)0x100000000;
  local_f8._M_len = 0x300000002;
  local_e8._M_len = 4;
  local_e8._M_array = (iterator)&local_f8;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
              *)&m->matrix_,&local_e8,-1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x3a9);
  local_e8._M_len = local_e8._M_len & 0xffffffffffffff00;
  local_e8._M_array = (iterator)&PTR__lazy_ostream_001f1058;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_f8._M_array =
       (iterator)
       CONCAT44(local_f8._M_array._4_4_,(m->matrix_).super_Matrix_dimension_option.maxDim_);
  local_fc = 5;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_e8,&local_c0,0x3a9,1,2,&local_f8,"m.get_max_dimension()",&local_fc,"5");
  return;
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}